

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.h
# Opt level: O2

bool __thiscall
cmArgumentParser<cmCoreTryCompile::Arguments>::
Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
          (cmArgumentParser<cmCoreTryCompile::Arguments> *this,Arguments *result,
          cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *args,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *unparsedArguments,size_t pos)

{
  size_t sVar1;
  Instance instance;
  Instance local_70;
  
  local_70.Keyword._M_len = 0;
  local_70.Keyword._M_str = (char *)0x0;
  local_70.KeywordValuesSeen = 0;
  local_70.KeywordValuesExpected = 0;
  local_70.KeywordValueFunc.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_70.KeywordValueFunc.super__Function_base._M_functor._8_8_ = 0;
  local_70.KeywordValueFunc.super__Function_base._M_manager = (_Manager_type)0x0;
  local_70.KeywordValueFunc._M_invoker = (_Invoker_type)0x0;
  local_70.DoneWithPositional = false;
  local_70.Bindings = (ActionMap *)this;
  local_70.ParseResults = &result->super_ParseResult;
  local_70.UnparsedArguments = unparsedArguments;
  local_70.Result = result;
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            (&local_70,args,pos);
  sVar1 = (result->super_ParseResult).KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_node_count
  ;
  std::_Function_base::~_Function_base(&local_70.KeywordValueFunc.super__Function_base);
  return sVar1 == 0;
}

Assistant:

bool Parse(Result& result, Range const& args,
             std::vector<std::string>* unparsedArguments,
             std::size_t pos = 0) const
  {
    using ArgumentParser::AsParseResultPtr;
    ParseResult* parseResultPtr = AsParseResultPtr(result);
    Instance instance(this->Bindings, parseResultPtr, unparsedArguments,
                      &result);
    instance.Parse(args, pos);
    return parseResultPtr ? static_cast<bool>(*parseResultPtr) : true;
  }